

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.h
# Opt level: O0

learner<ect,_example> *
LEARNER::learner<ect,example>::init_learner<LEARNER::learner<char,example>>
          (ect *dat,learner<char,_example> *base,
          _func_void_ect_ptr_learner<char,_example>_ptr_example_ptr *learn,
          _func_void_ect_ptr_learner<char,_example>_ptr_example_ptr *predict,size_t ws,
          prediction_type_t pred_type)

{
  learner<ect,_example> *__dest;
  base_learner *pbVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  learner<char,_example> *in_RSI;
  undefined8 in_RDI;
  undefined8 in_R8;
  undefined4 in_R9D;
  learner<ect,_example> *ret;
  
  __dest = calloc_or_throw<LEARNER::learner<ect,example>>();
  if (in_RSI == (learner<char,_example> *)0x0) {
    *(undefined8 *)(__dest + 0xd8) = 1;
    *(undefined8 *)(__dest + 0xe0) = in_R8;
    *(code **)(__dest + 0x98) = noop;
    *(code **)(__dest + 0xb0) = noop;
    *(code **)(__dest + 0x10) = noop;
    *(code **)(__dest + 0x80) = noop_sl;
    *(undefined8 *)(__dest + 0xb8) = in_RDI;
    *(code **)(__dest + 200) = noop;
    *(code **)(__dest + 0x50) = noop_sensitivity;
    *(undefined8 *)(__dest + 0x58) = in_RDI;
    *(code **)(__dest + 0x68) = return_simple_example;
  }
  else {
    memcpy(__dest,in_RSI,0xe9);
    pbVar1 = make_base<char,example>(in_RSI);
    *(base_learner **)(__dest + 0x20) = pbVar1;
    *(code **)(__dest + 0x50) = recur_sensitivity;
    *(undefined8 *)(__dest + 0xb8) = in_RDI;
    pbVar1 = make_base<char,example>(in_RSI);
    *(base_learner **)(__dest + 0xc0) = pbVar1;
    *(code **)(__dest + 200) = noop;
    *(undefined8 *)(__dest + 0xd8) = in_R8;
    *(long *)(__dest + 0xe0) = *(long *)(in_RSI + 0xe0) * *(long *)(__dest + 0xd8);
  }
  *(undefined8 *)(__dest + 0x18) = in_RDI;
  *(undefined8 *)(__dest + 0x28) = in_RDX;
  *(undefined8 *)(__dest + 0x38) = in_RDX;
  *(undefined8 *)(__dest + 0x30) = in_RCX;
  *(undefined8 *)(__dest + 0x40) = 0;
  *(undefined4 *)(__dest + 0xd0) = in_R9D;
  __dest[0xe8] = (learner<ect,_example>)0x0;
  return __dest;
}

Assistant:

static learner<T, E>& init_learner(T* dat, L* base, void (*learn)(T&, L&, E&), void (*predict)(T&, L&, E&), size_t ws,
      prediction_type::prediction_type_t pred_type)
  {
    learner<T, E>& ret = calloc_or_throw<learner<T, E> >();

    if (base != nullptr)
    {  // a reduction
      ret = *(learner<T, E>*)(base);
      ret.learn_fd.base = make_base(*base);
      ret.sensitivity_fd.sensitivity_f = (sensitivity_data::fn)recur_sensitivity;
      ret.finisher_fd.data = dat;
      ret.finisher_fd.base = make_base(*base);
      ret.finisher_fd.func = (func_data::fn)noop;
      ret.weights = ws;
      ret.increment = base->increment * ret.weights;
    }
    else  // a base learner
    {
      ret.weights = 1;
      ret.increment = ws;
      ret.end_pass_fd.func = (func_data::fn)noop;
      ret.end_examples_fd.func = (func_data::fn)noop;
      ret.init_fd.func = (func_data::fn)noop;
      ret.save_load_fd.save_load_f = (save_load_data::fn)noop_sl;
      ret.finisher_fd.data = dat;
      ret.finisher_fd.func = (func_data::fn)noop;
      ret.sensitivity_fd.sensitivity_f = (sensitivity_data::fn)noop_sensitivity;
      ret.finish_example_fd.data = dat;
      ret.finish_example_fd.finish_example_f = (finish_example_data::fn)return_simple_example;
    }

    ret.learn_fd.data = dat;
    ret.learn_fd.learn_f = (learn_data::fn)learn;
    ret.learn_fd.update_f = (learn_data::fn)learn;
    ret.learn_fd.predict_f = (learn_data::fn)predict;
    ret.learn_fd.multipredict_f = nullptr;
    ret.pred_type = pred_type;
    ret.is_multiline = std::is_same<multi_ex, E>::value;

    return ret;
  }